

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

TCGv_i32 iwmmxt_load_creg(TCGContext_conflict1 *tcg_ctx,int reg)

{
  TCGTemp *a1;
  
  a1 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i32,(TCGArg)a1,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                      (ulong)(uint)reg * 4 + 0x2fa0);
  return (TCGv_i32)((long)a1 - (long)tcg_ctx);
}

Assistant:

static inline TCGv_i32 iwmmxt_load_creg(TCGContext *tcg_ctx, int reg)
{
    TCGv_i32 var = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ld_i32(tcg_ctx, var, tcg_ctx->cpu_env, offsetof(CPUARMState, iwmmxt.cregs[reg]));
    return var;
}